

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-join.c
# Opt level: O0

int run_test_udp_multicast_join(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  int64_t eval_b_13;
  int64_t eval_a_13;
  int64_t eval_b_12;
  int64_t eval_a_12;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in addr;
  int r;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-multicast-join.c"
            ,0x93,"uv_ip4_addr(\"0.0.0.0\", 9123, &addr)","==","0",(long)iVar1,"==",0);
    abort();
  }
  puVar2 = uv_default_loop();
  addr.sin_zero._0_4_ = uv_udp_init(puVar2,&server);
  if ((long)(int)addr.sin_zero._0_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-multicast-join.c"
            ,0x96,"r","==","0",(long)(int)addr.sin_zero._0_4_,"==",0);
    abort();
  }
  puVar2 = uv_default_loop();
  addr.sin_zero._0_4_ = uv_udp_init(puVar2,&client);
  if ((long)(int)addr.sin_zero._0_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-multicast-join.c"
            ,0x99,"r","==","0",(long)(int)addr.sin_zero._0_4_,"==",0);
    abort();
  }
  addr.sin_zero._0_4_ = uv_udp_bind(&server,(sockaddr *)&eval_a,0);
  if ((long)(int)addr.sin_zero._0_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-multicast-join.c"
            ,0x9d,"r","==","0",(long)(int)addr.sin_zero._0_4_,"==",0);
    abort();
  }
  addr.sin_zero._0_4_ = uv_udp_set_membership(&server,"239.255.0.1",(char *)0x0,UV_JOIN_GROUP);
  if (addr.sin_zero._0_4_ == -0x13) {
    fprintf(_stderr,"%s\n","No multicast support.");
    fflush(_stderr);
    addr.sin_zero[4] = '\a';
    addr.sin_zero[5] = '\0';
    addr.sin_zero[6] = '\0';
    addr.sin_zero[7] = '\0';
  }
  else {
    if ((long)(int)addr.sin_zero._0_4_ != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-multicast-join.c"
              ,0xa3,"r","==","0",(long)(int)addr.sin_zero._0_4_,"==",0);
      abort();
    }
    addr.sin_zero._0_4_ = uv_udp_recv_start(&server,alloc_cb,cl_recv_cb);
    if ((long)(int)addr.sin_zero._0_4_ != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-multicast-join.c"
              ,0xaa,"r","==","0",(long)(int)addr.sin_zero._0_4_,"==",0);
      abort();
    }
    addr.sin_zero._0_4_ = do_send(&req);
    if ((long)(int)addr.sin_zero._0_4_ != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-multicast-join.c"
              ,0xad,"r","==","0",(long)(int)addr.sin_zero._0_4_,"==",0);
      abort();
    }
    if ((long)close_cb_called != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-multicast-join.c"
              ,0xaf,"close_cb_called","==","0",(long)close_cb_called,"==",0);
      abort();
    }
    if ((long)cl_recv_cb_called != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-multicast-join.c"
              ,0xb0,"cl_recv_cb_called","==","0",(long)cl_recv_cb_called,"==",0);
      abort();
    }
    if ((long)sv_send_cb_called != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-multicast-join.c"
              ,0xb1,"sv_send_cb_called","==","0",(long)sv_send_cb_called,"==",0);
      abort();
    }
    puVar2 = uv_default_loop();
    uv_run(puVar2,UV_RUN_DEFAULT);
    if ((long)cl_recv_cb_called != 2) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-multicast-join.c"
              ,0xb6,"2","==","cl_recv_cb_called",2,"==",(long)cl_recv_cb_called);
      abort();
    }
    if ((long)sv_send_cb_called != 2) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-multicast-join.c"
              ,0xb7,"2","==","sv_send_cb_called",2,"==",(long)sv_send_cb_called);
      abort();
    }
    if ((long)close_cb_called != 2) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-multicast-join.c"
              ,0xb8,"2","==","close_cb_called",2,"==",(long)close_cb_called);
      abort();
    }
    puVar2 = uv_default_loop();
    close_loop(puVar2);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-multicast-join.c"
              ,0xba,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
      abort();
    }
    uv_library_shutdown();
    addr.sin_zero[4] = '\0';
    addr.sin_zero[5] = '\0';
    addr.sin_zero[6] = '\0';
    addr.sin_zero[7] = '\0';
  }
  iVar1._0_1_ = addr.sin_zero[4];
  iVar1._1_1_ = addr.sin_zero[5];
  iVar1._2_1_ = addr.sin_zero[6];
  iVar1._3_1_ = addr.sin_zero[7];
  return iVar1;
}

Assistant:

TEST_IMPL(udp_multicast_join) {
#if defined(__OpenBSD__)
  RETURN_SKIP("Test does not currently work in OpenBSD");
#endif
  int r;
  struct sockaddr_in addr;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT_OK(r);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  /* bind to the desired port */
  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  /* join the multicast channel */
  r = uv_udp_set_membership(&server, MULTICAST_ADDR, NULL, UV_JOIN_GROUP);
  if (r == UV_ENODEV)
    RETURN_SKIP("No multicast support.");
  ASSERT_OK(r);
#if defined(__ANDROID__)
  /* It returns an ENOSYS error */
  RETURN_SKIP("Test does not currently work in ANDROID");
#endif

  r = uv_udp_recv_start(&server, alloc_cb, cl_recv_cb);
  ASSERT_OK(r);

  r = do_send(&req);
  ASSERT_OK(r);

  ASSERT_OK(close_cb_called);
  ASSERT_OK(cl_recv_cb_called);
  ASSERT_OK(sv_send_cb_called);

  /* run the loop till all events are processed */
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(2, cl_recv_cb_called);
  ASSERT_EQ(2, sv_send_cb_called);
  ASSERT_EQ(2, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}